

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_short>::sortMinDown
          (btAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          btDispatcher *param_4,bool updateOverlaps)

{
  Edge EVar1;
  Edge *pEVar2;
  bool bVar3;
  unsigned_short uVar4;
  uint axis0;
  Handle *pHandleA;
  Handle *pHandleB;
  ushort in_DX;
  int in_ESI;
  btAxisSweep3Internal<unsigned_short> *in_RDI;
  byte in_R8B;
  Edge swap;
  int axis2;
  int axis1;
  Handle *pHandlePrev;
  Handle *pHandleEdge;
  Edge *pPrev;
  Edge *pEdge;
  Edge *local_30;
  Edge *local_28;
  
  local_28 = in_RDI->m_pEdges[in_ESI] + (int)(uint)in_DX;
  pHandleA = getHandle(in_RDI,local_28->m_handle);
  pEVar2 = local_28;
  for (; local_30 = pEVar2 + -1, local_28->m_pos < local_30->m_pos; local_28 = local_28 + -1) {
    pHandleB = getHandle(in_RDI,pEVar2[-1].m_handle);
    uVar4 = Edge::IsMax(local_30);
    if (uVar4 == 0) {
      pHandleB->m_maxEdges[(long)in_ESI + -3] = pHandleB->m_maxEdges[(long)in_ESI + -3] + 1;
    }
    else {
      axis0 = 1 << ((byte)in_ESI & 0x1f) & 3;
      if ((((in_R8B & 1) != 0) &&
          (bVar3 = testOverlap2D(in_RDI,pHandleA,pHandleB,axis0,1 << (sbyte)axis0 & 3), bVar3)) &&
         ((*(in_RDI->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
            [2])(in_RDI->m_pairCache,pHandleA,pHandleB),
         in_RDI->m_userPairCallback != (btOverlappingPairCallback *)0x0)) {
        (*in_RDI->m_userPairCallback->_vptr_btOverlappingPairCallback[2])
                  (in_RDI->m_userPairCallback,pHandleA,pHandleB);
      }
      pHandleB->m_maxEdges[in_ESI] = pHandleB->m_maxEdges[in_ESI] + 1;
    }
    pHandleA->m_maxEdges[(long)in_ESI + -3] = pHandleA->m_maxEdges[(long)in_ESI + -3] - 1;
    EVar1 = *local_28;
    *local_28 = *local_30;
    *local_30 = EVar1;
    pEVar2 = local_30;
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMinDown(int axis, BP_FP_INT_TYPE edge, btDispatcher* /* dispatcher */, bool updateOverlaps)
{

	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pPrev = pEdge - 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pEdge->m_pos < pPrev->m_pos)
	{
		Handle* pHandlePrev = getHandle(pPrev->m_handle);

		if (pPrev->IsMax())
		{
			// if previous edge is a maximum check the bounds and add an overlap if necessary
			const int axis1 = (1  << axis) & 3;
			const int axis2 = (1  << axis1) & 3;
			if (updateOverlaps && testOverlap2D(pHandleEdge, pHandlePrev,axis1,axis2))
			{
				m_pairCache->addOverlappingPair(pHandleEdge,pHandlePrev);
				if (m_userPairCallback)
					m_userPairCallback->addOverlappingPair(pHandleEdge,pHandlePrev);

				//AddOverlap(pEdge->m_handle, pPrev->m_handle);

			}

			// update edge reference in other handle
			pHandlePrev->m_maxEdges[axis]++;
		}
		else
			pHandlePrev->m_minEdges[axis]++;

		pHandleEdge->m_minEdges[axis]--;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pPrev;
		*pPrev = swap;

		// decrement
		pEdge--;
		pPrev--;
	}

#ifdef DEBUG_BROADPHASE
	debugPrintAxis(axis);
#endif //DEBUG_BROADPHASE

}